

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::ReScanNodes(BasePort *this,string *caller)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  
  uVar1 = this->FwBusGeneration;
  (*this->_vptr_BasePort[0x13])(this,(ulong)this->newFwBusGeneration);
  iVar2 = (*this->_vptr_BasePort[3])(this);
  if (SUB41(iVar2,0) == false) {
    poVar3 = std::operator<<(this->outStr,(string *)caller);
    poVar3 = std::operator<<(poVar3,": failed to rescan nodes");
    std::endl<char,std::char_traits<char>>(poVar3);
    (*this->_vptr_BasePort[0x13])(this,(ulong)uVar1);
  }
  return SUB41(iVar2,0);
}

Assistant:

bool BasePort::ReScanNodes(const std::string &caller)
{
    unsigned int oldFwBusGeneration = FwBusGeneration;
    UpdateBusGeneration(newFwBusGeneration);
    bool ret = ScanNodes();
    if (!ret) {
        outStr << caller << ": failed to rescan nodes" << std::endl;
        UpdateBusGeneration(oldFwBusGeneration);
    }
    return ret;
}